

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxDumper.h
# Opt level: O3

Action __thiscall
psy::C::SyntaxDumper::visitExtGNU_ChooseExpression
          (SyntaxDumper *this,ExtGNU_ChooseExpressionSyntax *node)

{
  SyntaxToken local_50;
  
  SyntaxNode::tokenAtIndex(&local_50,(SyntaxNode *)node,node->kwTkIdx_);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&local_50,node);
  SyntaxToken::~SyntaxToken(&local_50);
  SyntaxNode::tokenAtIndex(&local_50,(SyntaxNode *)node,node->openParenTkIdx_);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&local_50,node);
  SyntaxToken::~SyntaxToken(&local_50);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5e])(this,node->constExpr_);
  SyntaxNode::tokenAtIndex(&local_50,(SyntaxNode *)node,node->commaTkIdx1_);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&local_50,node);
  SyntaxToken::~SyntaxToken(&local_50);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5e])(this,node->expr1_);
  SyntaxNode::tokenAtIndex(&local_50,(SyntaxNode *)node,node->commaTkIdx2_);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&local_50,node);
  SyntaxToken::~SyntaxToken(&local_50);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5e])(this,node->expr2_);
  SyntaxNode::tokenAtIndex(&local_50,(SyntaxNode *)node,node->closeParenTkIdx_);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&local_50,node);
  SyntaxToken::~SyntaxToken(&local_50);
  return Skip;
}

Assistant:

virtual Action visitExtGNU_ChooseExpression(const ExtGNU_ChooseExpressionSyntax* node) override
    {
        terminal(node->keyword(), node);
        terminal(node->openParenthesisToken(), node);
        nonterminal(node->constantExpression());
        terminal(node->commaToken1(), node);
        nonterminal(node->expression1());
        terminal(node->commaToken2(), node);
        nonterminal(node->expression2());
        terminal(node->closeParenthesisToken(), node);
        return Action::Skip;
    }